

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall re2c::OutputBlock::OutputBlock(OutputBlock *this)

{
  OutputFragment *this_00;
  OutputFragment *local_18;
  OutputBlock *local_10;
  OutputBlock *this_local;
  
  (this->fragments).
  super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fragments).
  super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fragments).
  super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10 = this;
  std::vector<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>::vector
            (&this->fragments);
  this->used_yyaccept = false;
  this->force_start_label = false;
  std::__cxx11::string::string((string *)&this->user_start_label);
  this->line = 0;
  this_00 = (OutputFragment *)operator_new(0x188);
  OutputFragment::OutputFragment(this_00,CODE,0);
  local_18 = this_00;
  std::vector<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>::push_back
            (&this->fragments,&local_18);
  return;
}

Assistant:

OutputBlock::OutputBlock ()
	: fragments ()
	, used_yyaccept (false)
	, force_start_label (false)
	, user_start_label ()
	, line (0)
{
	fragments.push_back (new OutputFragment (OutputFragment::CODE, 0));
}